

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O1

void leb__HeapWrite_BitField(leb_Heap *leb,leb_Node node,uint32_t bitValue)

{
  uint uVar1;
  
  if (node.id != node.depth) {
    node.id = node.id << ((char)leb->maxDepth - (char)node.depth & 0x1fU);
    node.depth = leb->maxDepth;
  }
  uVar1 = ((leb->maxDepth - node.depth) + 1) * node.id + (2 << ((byte)node.depth & 0x1f));
  leb->buffer[uVar1 >> 5] =
       bitValue << ((byte)uVar1 & 0x1f) | leb->buffer[uVar1 >> 5] & ~(1 << (uVar1 & 0x1f));
  return;
}

Assistant:

static void
leb__HeapWrite_BitField(
    leb_Heap *leb,
    const leb_Node node,
    const uint32_t bitValue
) {
    uint32_t bitID = leb__NodeBitID_BitField(leb, node);

    leb__SetBitValue(&leb->buffer[bitID >> 5u], bitID & 31u, bitValue);
}